

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeLegacyDylinkSection(WasmBinaryWriter *this)

{
  BufferWithRandomAccess *pBVar1;
  bool bVar2;
  pointer pDVar3;
  size_type sVar4;
  string_view *psVar5;
  Name *neededDynlib;
  iterator __end1;
  iterator __begin1;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range1;
  U32LEB local_38;
  U32LEB local_34;
  U32LEB local_30;
  U32LEB local_2c;
  string_view local_28;
  int32_t local_14;
  WasmBinaryWriter *pWStack_10;
  int32_t start;
  WasmBinaryWriter *this_local;
  
  pWStack_10 = this;
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->wasm->dylinkSection);
  if (bVar2) {
    local_14 = startSection<wasm::BinaryConsts::Section>(this,Custom);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,BinaryConsts::CustomSections::Dylink);
    writeInlineString(this,local_28);
    pBVar1 = this->o;
    pDVar3 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
             operator->(&this->wasm->dylinkSection);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_2c,pDVar3->memorySize);
    BufferWithRandomAccess::operator<<(pBVar1,local_2c);
    pBVar1 = this->o;
    pDVar3 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
             operator->(&this->wasm->dylinkSection);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_30,pDVar3->memoryAlignment);
    BufferWithRandomAccess::operator<<(pBVar1,local_30);
    pBVar1 = this->o;
    pDVar3 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
             operator->(&this->wasm->dylinkSection);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_34,pDVar3->tableSize);
    BufferWithRandomAccess::operator<<(pBVar1,local_34);
    pBVar1 = this->o;
    pDVar3 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
             operator->(&this->wasm->dylinkSection);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_38,pDVar3->tableAlignment);
    BufferWithRandomAccess::operator<<(pBVar1,local_38);
    pBVar1 = this->o;
    pDVar3 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
             operator->(&this->wasm->dylinkSection);
    sVar4 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(&pDVar3->neededDynlibs);
    LEB<unsigned_int,_unsigned_char>::LEB
              ((LEB<unsigned_int,_unsigned_char> *)((long)&__range1 + 4),(uint)sVar4);
    BufferWithRandomAccess::operator<<(pBVar1,__range1._4_4_);
    pDVar3 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
             operator->(&this->wasm->dylinkSection);
    __end1 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin(&pDVar3->neededDynlibs);
    neededDynlib = (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end
                                     (&pDVar3->neededDynlibs);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                       *)&neededDynlib), bVar2) {
      psVar5 = (string_view *)
               __gnu_cxx::
               __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
               ::operator*(&__end1);
      writeInlineString(this,*psVar5);
      __gnu_cxx::
      __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
      operator++(&__end1);
    }
    finishSection(this,local_14);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeLegacyDylinkSection() {
  if (!wasm->dylinkSection) {
    return;
  }

  auto start = startSection(BinaryConsts::Custom);
  writeInlineString(BinaryConsts::CustomSections::Dylink);
  o << U32LEB(wasm->dylinkSection->memorySize);
  o << U32LEB(wasm->dylinkSection->memoryAlignment);
  o << U32LEB(wasm->dylinkSection->tableSize);
  o << U32LEB(wasm->dylinkSection->tableAlignment);
  o << U32LEB(wasm->dylinkSection->neededDynlibs.size());
  for (auto& neededDynlib : wasm->dylinkSection->neededDynlibs) {
    writeInlineString(neededDynlib.str);
  }
  finishSection(start);
}